

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O1

void __thiscall
glslang::TSymbolTable::setVariableExtensions
          (TSymbolTable *this,char *blockName,char *name,int numExts,char **extensions)

{
  long lVar1;
  char cVar2;
  int iVar3;
  TSymbol *pTVar4;
  undefined4 extraout_var;
  long *plVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  long lVar8;
  ulong uVar9;
  pool_allocator<char> local_60;
  TString local_58;
  long *plVar5;
  
  local_60.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             blockName,&local_60);
  pTVar4 = find(this,&local_58,(bool *)0x0,(bool *)0x0,(int *)0x0);
  if (pTVar4 != (TSymbol *)0x0) {
    iVar3 = (*pTVar4->_vptr_TSymbol[9])(pTVar4);
    plVar5 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar5 == (long *)0x0) {
      __assert_fail("variable != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                    ,0x38a,
                    "void glslang::TSymbolTable::setVariableExtensions(const char *, const char *, int, const char *const *)"
                   );
    }
    plVar6 = (long *)(**(code **)(*plVar5 + 0x48))(plVar5);
    plVar6 = (long *)(**(code **)(*plVar6 + 0x60))(plVar6);
    cVar2 = (**(code **)(*plVar6 + 0x128))(plVar6);
    if (cVar2 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    lVar1 = plVar6[0xd];
    lVar7 = *(long *)(lVar1 + 8);
    if (0 < (int)((ulong)(*(long *)(lVar1 + 0x10) - lVar7) >> 5)) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(**(long **)(lVar7 + lVar8) + 0x30))();
        iVar3 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (this_00,name);
        if (iVar3 == 0) {
          (**(code **)(*plVar5 + 0xf0))(plVar5,uVar9 & 0xffffffff,numExts,extensions);
          return;
        }
        uVar9 = uVar9 + 1;
        lVar7 = *(long *)(lVar1 + 8);
        lVar8 = lVar8 + 0x20;
      } while ((long)uVar9 < (long)(int)((ulong)(*(long *)(lVar1 + 0x10) - lVar7) >> 5));
    }
  }
  return;
}

Assistant:

void setVariableExtensions(const char* blockName, const char* name, int numExts, const char* const extensions[])
    {
        TSymbol* symbol = find(TString(blockName));
        if (symbol == nullptr)
            return;
        TVariable* variable = symbol->getAsVariable();
        assert(variable != nullptr);

        const TTypeList& structure = *variable->getAsVariable()->getType().getStruct();
        for (int member = 0; member < (int)structure.size(); ++member) {
            if (structure[member].type->getFieldName().compare(name) == 0) {
                variable->setMemberExtensions(member, numExts, extensions);
                return;
            }
        }
    }